

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O2

void __thiscall
duckdb::UpdateSegment::Update
          (UpdateSegment *this,TransactionData transaction,idx_t column_index,Vector *update_p,
          row_t *ids,idx_t count,Vector *base_data)

{
  unique_ptr<duckdb::UpdateNode,_std::default_delete<duckdb::UpdateNode>,_true> *this_00;
  uint *__last;
  idx_t iVar1;
  initialize_update_function_t p_Var2;
  merge_update_function_t p_Var3;
  undefined1 auVar4 [24];
  undefined1 auVar5 [24];
  transaction_t tVar6;
  transaction_t tVar7;
  optional_ptr<duckdb::UndoBufferEntry,_true> __first;
  FileBuffer *pFVar8;
  pointer pUVar9;
  reference pvVar10;
  UpdateInfo *pUVar11;
  data_ptr_t pdVar12;
  DuckTransaction *pDVar13;
  UpdateInfo *pUVar14;
  TransactionException *this_01;
  FileBuffer *pFVar15;
  sel_t sVar16;
  undefined1 *puVar17;
  FileBuffer *pFVar18;
  UndoBufferReference *pUVar19;
  uint *__i;
  shared_ptr<duckdb::BlockHandle,_true> *__last_00;
  ulong uVar20;
  idx_t iVar21;
  long lVar22;
  UndoBufferPointer UVar23;
  optional_ptr<duckdb::UpdateInfo,_true> node;
  optional_ptr<duckdb::FileBuffer,_true> local_180;
  allocator local_171;
  ulong local_170;
  SelectionVector sel;
  UndoBufferReference pin;
  unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true> write_lock;
  UndoBufferReference root_pin;
  unsafe_unique_array<char> update_info_data;
  UndoBufferReference node_ref;
  value_type root_pointer;
  UnifiedVectorFormat update_format;
  
  StorageLock::GetExclusiveLock((StorageLock *)&write_lock);
  UnifiedVectorFormat::UnifiedVectorFormat(&update_format);
  Vector::ToUnifiedFormat(update_p,count,&update_format);
  sel.sel_vector = (sel_t *)0x0;
  sel.selection_data.internal.super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  sel.selection_data.internal.super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ::std::mutex::lock(&this->stats_lock);
  pFVar8 = (FileBuffer *)
           (*this->statistics_update_function)(this,&this->stats,&update_format,count,&sel);
  pthread_mutex_unlock((pthread_mutex_t *)&this->stats_lock);
  if (pFVar8 != (FileBuffer *)0x0) {
    pFVar15 = (FileBuffer *)0x1;
    do {
      local_180.ptr = pFVar8;
      root_pin.entry.ptr = (UndoBufferEntry *)ids;
      if (pFVar8 == pFVar15) goto LAB_01544687;
      if (sel.sel_vector == (sel_t *)0x0) {
        puVar17 = (undefined1 *)((long)&pFVar15[-1].internal_size + 7);
        pFVar18 = pFVar15;
      }
      else {
        puVar17 = (undefined1 *)(ulong)sel.sel_vector[(long)((long)&pFVar15[-1].internal_size + 7)];
        pFVar18 = (FileBuffer *)(ulong)sel.sel_vector[(long)pFVar15];
      }
      pFVar15 = (FileBuffer *)((long)&pFVar15->_vptr_FileBuffer + 1);
    } while (ids[(long)puVar17] < ids[(long)pFVar18]);
    SelectionVector::SelectionVector((SelectionVector *)&pin,(idx_t)pFVar8);
    __first = pin.entry;
    for (pFVar15 = (FileBuffer *)0x0; pFVar8 != pFVar15;
        pFVar15 = (FileBuffer *)((long)&pFVar15->_vptr_FileBuffer + 1)) {
      sVar16 = (sel_t)pFVar15;
      if (sel.sel_vector != (sel_t *)0x0) {
        sVar16 = sel.sel_vector[(long)pFVar15];
      }
      *(sel_t *)((long)&(pin.entry.ptr)->buffer_manager + (long)pFVar15 * 4) = sVar16;
    }
    __last = (uint *)((long)&(pin.entry.ptr)->buffer_manager + (long)pFVar8 * 4);
    lVar22 = 0x3f;
    if (pFVar8 != (FileBuffer *)0x0) {
      for (; (ulong)pFVar8 >> lVar22 == 0; lVar22 = lVar22 + -1) {
      }
    }
    ::std::
    __introsort_loop<unsigned_int*,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::SortSelectionVector(duckdb::SelectionVector&,unsigned_long,long*)::__0>>
              ((uint *)pin.entry.ptr,__last,(ulong)(((uint)lVar22 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_lnkuiper[P]duckdb_src_storage_table_update_segment_cpp:1122:58)>
                )&root_pin);
    if ((long)pFVar8 < 0x11) {
      ::std::
      __insertion_sort<unsigned_int*,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::SortSelectionVector(duckdb::SelectionVector&,unsigned_long,long*)::__0>>
                ((uint *)__first.ptr,__last,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_lnkuiper[P]duckdb_src_storage_table_update_segment_cpp:1122:58)>
                  )&root_pin);
    }
    else {
      __last_00 = &__first.ptr[1].block;
      ::std::
      __insertion_sort<unsigned_int*,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::SortSelectionVector(duckdb::SelectionVector&,unsigned_long,long*)::__0>>
                ((uint *)__first.ptr,(uint *)__last_00,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_lnkuiper[P]duckdb_src_storage_table_update_segment_cpp:1122:58)>
                  )&root_pin);
      for (lVar22 = (long)pFVar8 * 4 + -0x40; lVar22 != 0; lVar22 = lVar22 + -4) {
        ::std::
        __unguarded_linear_insert<unsigned_int*,__gnu_cxx::__ops::_Val_comp_iter<duckdb::SortSelectionVector(duckdb::SelectionVector&,unsigned_long,long*)::__0>>
                  ((uint *)__last_00,
                   (_Val_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_lnkuiper[P]duckdb_src_storage_table_update_segment_cpp:1122:58)>
                    )&root_pin);
        __last_00 = (shared_ptr<duckdb::BlockHandle,_true> *)
                    ((long)&(__last_00->internal).
                            super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr + 4);
      }
    }
    local_180.ptr = (FileBuffer *)0x1;
    for (pFVar15 = (FileBuffer *)0x1; pFVar15 < pFVar8;
        pFVar15 = (FileBuffer *)((long)&pFVar15->_vptr_FileBuffer + 1)) {
      if (pin.entry.ptr == (UndoBufferEntry *)0x0) {
        puVar17 = (undefined1 *)((long)&pFVar15[-1].internal_size + 7);
        pFVar18 = pFVar15;
      }
      else {
        puVar17 = (undefined1 *)(ulong)*(uint *)((long)pin.entry.ptr + (long)pFVar15 * 4 + -4);
        pFVar18 = (FileBuffer *)
                  (ulong)*(uint *)((long)&(pin.entry.ptr)->buffer_manager + (long)pFVar15 * 4);
      }
      if ((&(root_pin.entry.ptr)->buffer_manager)[(long)puVar17] !=
          (&(root_pin.entry.ptr)->buffer_manager)[(long)pFVar18]) {
        *(int *)((long)&(pin.entry.ptr)->buffer_manager + (long)local_180.ptr * 4) = (int)pFVar18;
        local_180.ptr = (FileBuffer *)((long)&(local_180.ptr)->_vptr_FileBuffer + 1);
      }
    }
    SelectionVector::Initialize(&sel,(SelectionVector *)&pin);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&pin.handle.handle.internal.
                super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
LAB_01544687:
    if (sel.sel_vector == (sel_t *)0x0) {
      uVar20 = 0;
    }
    else {
      uVar20 = (ulong)*sel.sel_vector;
    }
    iVar21 = this->column_data->start;
    uVar20 = ids[uVar20] - iVar21;
    local_170 = uVar20 >> 0xb;
    InitializeUpdateInfo(this,local_170);
    this_00 = &this->root;
    pUVar9 = unique_ptr<duckdb::UpdateNode,_std::default_delete<duckdb::UpdateNode>,_true>::
             operator->(this_00);
    pvVar10 = vector<duckdb::UndoBufferPointer,_true>::get<true>(&pUVar9->info,local_170);
    iVar21 = (uVar20 & 0xfffffffffffff800) + iVar21;
    if (pvVar10->entry == (UndoBufferEntry *)0x0) {
      iVar1 = this->type_size;
      pUVar9 = unique_ptr<duckdb::UpdateNode,_std::default_delete<duckdb::UpdateNode>,_true>::
               operator->(this_00);
      UndoBufferAllocator::Allocate
                (&pin,&pUVar9->allocator,iVar1 * 0x800 + 0x204f & 0xfffffffffffff848);
      pUVar14 = (UpdateInfo *)UndoBufferReference::Ptr(&pin);
      pUVar14->max = 0x800;
      LOCK();
      (pUVar14->version_number).super___atomic_base<unsigned_long>._M_i = 0x400000000000005f;
      UNLOCK();
      pUVar14->segment = (UpdateSegment *)0x0;
      (pUVar14->prev).entry = (UndoBufferEntry *)0x0;
      (pUVar14->next).entry = (UndoBufferEntry *)0x0;
      pUVar14->column_index = column_index;
      pUVar11 = pUVar14;
      InitializeUpdateInfo(this,pUVar14,ids,&sel,(idx_t)local_180.ptr,local_170,iVar21);
      update_info_data.super_unique_ptr<char[],_std::default_delete<char[]>_>._M_t.
      super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
      super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
      super__Head_base<0UL,_char_*,_false>._M_head_impl =
           (unique_ptr<char[],_std::default_delete<char[]>_>)
           (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)0x0;
      UndoBufferReference::UndoBufferReference(&root_pin);
      if (transaction.transaction.ptr == (DuckTransaction *)0x0) {
        auVar4._8_8_ = transaction.start_time;
        auVar4._0_8_ = transaction.transaction_id;
        auVar4._16_8_ = 0;
        node.ptr = CreateEmptyUpdateInfo
                             ((TransactionData)(auVar4 << 0x40),this->type_size,pUVar11,
                              &update_info_data);
      }
      else {
        pDVar13 = optional_ptr<duckdb::DuckTransaction,_true>::operator->(&transaction.transaction);
        DuckTransaction::CreateUpdateInfo(&node_ref,pDVar13,this->type_size,(idx_t)local_180.ptr);
        UndoBufferReference::operator=(&root_pin,&node_ref);
        BufferHandle::~BufferHandle(&node_ref.handle);
        node.ptr = (UpdateInfo *)UndoBufferReference::Ptr(&root_pin);
      }
      pUVar11 = optional_ptr<duckdb::UpdateInfo,_true>::operator*(&node);
      InitializeUpdateInfo(this,pUVar11,ids,&sel,(idx_t)local_180.ptr,local_170,iVar21);
      p_Var2 = this->initialize_update_function;
      pUVar11 = optional_ptr<duckdb::UpdateInfo,_true>::operator*(&node);
      (*p_Var2)(pUVar11,base_data,pUVar14,&update_format,&sel);
      if (transaction.transaction.ptr == (DuckTransaction *)0x0) {
        UVar23 = (UndoBufferPointer)ZEXT816(0);
      }
      else {
        UVar23 = UndoBufferReference::GetBufferPointer(&root_pin);
      }
      pUVar14->next = UVar23;
      (pUVar14->prev).entry = (UndoBufferEntry *)0x0;
      (pUVar14->prev).position = 0;
      pUVar11 = optional_ptr<duckdb::UpdateInfo,_true>::operator->(&node);
      (pUVar11->next).entry = (UndoBufferEntry *)0x0;
      (pUVar11->next).position = 0;
      UVar23 = UndoBufferReference::GetBufferPointer(&pin);
      pUVar11 = optional_ptr<duckdb::UpdateInfo,_true>::operator->(&node);
      pUVar11->prev = UVar23;
      pUVar11 = optional_ptr<duckdb::UpdateInfo,_true>::operator->(&node);
      pUVar11->column_index = column_index;
      optional_ptr<duckdb::UpdateInfo,_true>::operator->(&node);
      UVar23 = UndoBufferReference::GetBufferPointer(&pin);
      pUVar9 = unique_ptr<duckdb::UpdateNode,_std::default_delete<duckdb::UpdateNode>,_true>::
               operator->(this_00);
      pvVar10 = vector<duckdb::UndoBufferPointer,_true>::get<true>(&pUVar9->info,local_170);
      pvVar10->entry = UVar23.entry;
      pvVar10->position = UVar23.position;
      BufferHandle::~BufferHandle(&root_pin.handle);
      ::std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
                (&update_info_data.super_unique_ptr<char[],_std::default_delete<char[]>_>);
      pUVar19 = &pin;
    }
    else {
      pUVar9 = unique_ptr<duckdb::UpdateNode,_std::default_delete<duckdb::UpdateNode>,_true>::
               operator->(this_00);
      pvVar10 = vector<duckdb::UndoBufferPointer,_true>::get<true>(&pUVar9->info,local_170);
      root_pointer.entry = pvVar10->entry;
      root_pointer.position = pvVar10->position;
      pUVar19 = (UndoBufferReference *)&root_pointer;
      UndoBufferPointer::Pin(&root_pin,(UndoBufferPointer *)pUVar19);
      pUVar11 = (UpdateInfo *)UndoBufferReference::Ptr(&root_pin);
      UndoBufferReference::UndoBufferReference(&node_ref);
      tVar7 = transaction.start_time;
      tVar6 = transaction.transaction_id;
      node.ptr = (UpdateInfo *)(pUVar11->next).entry;
      while (node.ptr != (UpdateInfo *)0x0) {
        pUVar19 = (UndoBufferReference *)&node;
        UndoBufferPointer::Pin(&pin,(UndoBufferPointer *)&node);
        pdVar12 = UndoBufferReference::Ptr(&pin);
        if (*(transaction_t *)(pdVar12 + 0x10) == tVar6) {
          pUVar19 = &pin;
          UndoBufferReference::operator=(&node_ref,&pin);
        }
        else if (tVar7 < *(ulong *)(pdVar12 + 0x10)) {
          pFVar8 = (FileBuffer *)0x0;
          pUVar19 = (UndoBufferReference *)0x0;
          do {
            while( true ) {
              pFVar15 = pFVar8;
              if (sel.sel_vector != (sel_t *)0x0) {
                pFVar15 = (FileBuffer *)(ulong)sel.sel_vector[(long)pFVar8];
              }
              if (ids[(long)pFVar15] - iVar21 ==
                  (ulong)*(uint *)(pdVar12 + (long)pUVar19 * 4 + 0x48)) {
                this_01 = (TransactionException *)__cxa_allocate_exception(0x10);
                ::std::__cxx11::string::string
                          ((string *)&update_info_data,"Conflict on update!",&local_171);
                TransactionException::TransactionException(this_01,(string *)&update_info_data);
                __cxa_throw(this_01,&TransactionException::typeinfo,
                            ::std::runtime_error::~runtime_error);
              }
              if ((long)(ids[(long)pFVar15] - iVar21) <
                  (long)(ulong)*(uint *)(pdVar12 + (long)pUVar19 * 4 + 0x48)) break;
              pUVar19 = (UndoBufferReference *)((long)&(pUVar19->entry).ptr + 1);
              if ((UndoBufferReference *)(ulong)*(uint *)(pdVar12 + 0x20) == pUVar19)
              goto LAB_0154480f;
            }
            pFVar8 = (FileBuffer *)((long)&pFVar8->_vptr_FileBuffer + 1);
          } while (pFVar8 != local_180.ptr);
        }
LAB_0154480f:
        node.ptr = *(UpdateInfo **)(pdVar12 + 0x38);
        BufferHandle::~BufferHandle(&pin.handle);
      }
      update_info_data.super_unique_ptr<char[],_std::default_delete<char[]>_>._M_t.
      super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
      super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
      super__Head_base<0UL,_char_*,_false>._M_head_impl =
           (unique_ptr<char[],_std::default_delete<char[]>_>)
           (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)0x0;
      node.ptr = (UpdateInfo *)0x0;
      if (node_ref.entry.ptr == (UndoBufferEntry *)0x0) {
        if (transaction.transaction.ptr == (DuckTransaction *)0x0) {
          auVar5._8_8_ = transaction.start_time;
          auVar5._0_8_ = transaction.transaction_id;
          auVar5._16_8_ = 0;
          node.ptr = CreateEmptyUpdateInfo
                               ((TransactionData)(auVar5 << 0x40),this->type_size,(idx_t)pUVar19,
                                &update_info_data);
        }
        else {
          pDVar13 = optional_ptr<duckdb::DuckTransaction,_true>::operator->
                              (&transaction.transaction);
          DuckTransaction::CreateUpdateInfo(&pin,pDVar13,this->type_size,(idx_t)local_180.ptr);
          UndoBufferReference::operator=(&node_ref,&pin);
          BufferHandle::~BufferHandle(&pin.handle);
          node.ptr = (UpdateInfo *)UndoBufferReference::Ptr(&node_ref);
        }
        pUVar14 = optional_ptr<duckdb::UpdateInfo,_true>::operator->(&node);
        pUVar14->segment = this;
        pUVar14 = optional_ptr<duckdb::UpdateInfo,_true>::operator->(&node);
        pUVar14->vector_index = local_170;
        pUVar14 = optional_ptr<duckdb::UpdateInfo,_true>::operator->(&node);
        pUVar14->N = 0;
        pUVar14 = optional_ptr<duckdb::UpdateInfo,_true>::operator->(&node);
        pUVar14->column_index = column_index;
        pUVar14 = optional_ptr<duckdb::UpdateInfo,_true>::operator->(&node);
        iVar21 = (pUVar11->next).position;
        (pUVar14->next).entry = (pUVar11->next).entry;
        (pUVar14->next).position = iVar21;
        pUVar14 = optional_ptr<duckdb::UpdateInfo,_true>::operator->(&node);
        if ((pUVar14->next).entry != (UndoBufferEntry *)0x0) {
          pUVar14 = optional_ptr<duckdb::UpdateInfo,_true>::operator->(&node);
          UndoBufferPointer::Pin(&pin,&pUVar14->next);
          pdVar12 = UndoBufferReference::Ptr(&pin);
          UVar23 = UndoBufferReference::GetBufferPointer(&node_ref);
          *(UndoBufferPointer *)(pdVar12 + 0x28) = UVar23;
          BufferHandle::~BufferHandle(&pin.handle);
        }
        pUVar14 = optional_ptr<duckdb::UpdateInfo,_true>::operator->(&node);
        (pUVar14->prev).entry = root_pointer.entry;
        (pUVar14->prev).position = root_pointer.position;
        if (transaction.transaction.ptr == (DuckTransaction *)0x0) {
          UVar23 = (UndoBufferPointer)ZEXT816(0);
        }
        else {
          UVar23 = UndoBufferReference::GetBufferPointer(&node_ref);
        }
        pUVar11->next = UVar23;
      }
      else {
        node.ptr = (UpdateInfo *)UndoBufferReference::Ptr(&node_ref);
      }
      optional_ptr<duckdb::UpdateInfo,_true>::operator->(&node);
      p_Var3 = this->merge_update_function;
      pUVar14 = optional_ptr<duckdb::UpdateInfo,_true>::operator*(&node);
      (*p_Var3)(pUVar11,base_data,pUVar14,&update_format,ids,(idx_t)local_180.ptr,&sel);
      optional_ptr<duckdb::UpdateInfo,_true>::operator->(&node);
      ::std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
                (&update_info_data.super_unique_ptr<char[],_std::default_delete<char[]>_>);
      BufferHandle::~BufferHandle(&node_ref.handle);
      pUVar19 = &root_pin;
    }
    BufferHandle::~BufferHandle(&pUVar19->handle);
  }
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&sel.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  UnifiedVectorFormat::~UnifiedVectorFormat(&update_format);
  ::std::unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>::
  ~unique_ptr(&write_lock.
               super_unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>
             );
  return;
}

Assistant:

void UpdateSegment::Update(TransactionData transaction, idx_t column_index, Vector &update_p, row_t *ids, idx_t count,
                           Vector &base_data) {
	// obtain an exclusive lock
	auto write_lock = lock.GetExclusiveLock();

	UnifiedVectorFormat update_format;
	update_p.ToUnifiedFormat(count, update_format);

	// update statistics
	SelectionVector sel;
	{
		lock_guard<mutex> stats_guard(stats_lock);
		count = statistics_update_function(this, stats, update_format, count, sel);
	}
	if (count == 0) {
		return;
	}

	// subsequent algorithms used by the update require row ids to be (1) sorted, and (2) unique
	// this is usually the case for "standard" queries (e.g. UPDATE tbl SET x=bla WHERE cond)
	// however, for more exotic queries involving e.g. cross products/joins this might not be the case
	// hence we explicitly check here if the ids are sorted and, if not, sort + duplicate eliminate them
	count = SortSelectionVector(sel, count, ids);
	D_ASSERT(count > 0);

	// get the vector index based on the first id
	// we assert that all updates must be part of the same vector
	auto first_id = ids[sel.get_index(0)];
	idx_t vector_index = (UnsafeNumericCast<idx_t>(first_id) - column_data.start) / STANDARD_VECTOR_SIZE;
	idx_t vector_offset = column_data.start + vector_index * STANDARD_VECTOR_SIZE;
	InitializeUpdateInfo(vector_index);

	D_ASSERT(idx_t(first_id) >= column_data.start);

	if (root->info[vector_index].IsSet()) {
		// there is already a version here, check if there are any conflicts and search for the node that belongs to
		// this transaction in the version chain
		auto root_pointer = root->info[vector_index];
		auto root_pin = root_pointer.Pin();
		auto &base_info = UpdateInfo::Get(root_pin);

		UndoBufferReference node_ref;
		CheckForConflicts(base_info.next, transaction, ids, sel, count, UnsafeNumericCast<row_t>(vector_offset),
		                  node_ref);

		// there are no conflicts - continue with the update
		unsafe_unique_array<char> update_info_data;
		optional_ptr<UpdateInfo> node;
		if (!node_ref.IsSet()) {
			// no updates made yet by this transaction: initially the update info to empty
			if (transaction.transaction) {
				auto &dtransaction = transaction.transaction->Cast<DuckTransaction>();
				node_ref = dtransaction.CreateUpdateInfo(type_size, count);
				node = &UpdateInfo::Get(node_ref);
			} else {
				node = CreateEmptyUpdateInfo(transaction, type_size, count, update_info_data);
			}
			node->segment = this;
			node->vector_index = vector_index;
			node->N = 0;
			node->column_index = column_index;

			// insert the new node into the chain
			node->next = base_info.next;
			if (node->next.IsSet()) {
				auto next_pin = node->next.Pin();
				auto &next_info = UpdateInfo::Get(next_pin);
				next_info.prev = node_ref.GetBufferPointer();
			}
			node->prev = root_pointer;
			base_info.next = transaction.transaction ? node_ref.GetBufferPointer() : UndoBufferPointer();
		} else {
			// we already had updates made to this transaction
			node = &UpdateInfo::Get(node_ref);
		}
		base_info.Verify();
		node->Verify();

		// now we are going to perform the merge
		merge_update_function(base_info, base_data, *node, update_format, ids, count, sel);

		base_info.Verify();
		node->Verify();
	} else {
		// there is no version info yet: create the top level update info and fill it with the updates
		// allocate space for the UpdateInfo in the allocator
		idx_t alloc_size = UpdateInfo::GetAllocSize(type_size);
		auto handle = root->allocator.Allocate(alloc_size);
		auto &update_info = UpdateInfo::Get(handle);
		UpdateInfo::Initialize(update_info, TRANSACTION_ID_START - 1);
		update_info.column_index = column_index;

		InitializeUpdateInfo(update_info, ids, sel, count, vector_index, vector_offset);

		// now create the transaction level update info in the undo log
		unsafe_unique_array<char> update_info_data;
		UndoBufferReference node_ref;
		optional_ptr<UpdateInfo> transaction_node;
		if (transaction.transaction) {
			node_ref = transaction.transaction->CreateUpdateInfo(type_size, count);
			transaction_node = &UpdateInfo::Get(node_ref);
		} else {
			transaction_node = CreateEmptyUpdateInfo(transaction, type_size, count, update_info_data);
		}

		InitializeUpdateInfo(*transaction_node, ids, sel, count, vector_index, vector_offset);

		// we write the updates in the update node data, and write the updates in the info
		initialize_update_function(*transaction_node, base_data, update_info, update_format, sel);

		update_info.next = transaction.transaction ? node_ref.GetBufferPointer() : UndoBufferPointer();
		update_info.prev = UndoBufferPointer();
		transaction_node->next = UndoBufferPointer();
		transaction_node->prev = handle.GetBufferPointer();
		transaction_node->column_index = column_index;

		transaction_node->Verify();
		update_info.Verify();

		root->info[vector_index] = handle.GetBufferPointer();
	}
}